

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_arith(lua_State *L,int op)

{
  TValue *io1;
  StkId pSVar1;
  
  pSVar1 = (L->top).p;
  if (0xfffffffd < op - 0xeU) {
    (pSVar1->val).value_ = pSVar1[-1].val.value_;
    (pSVar1->val).tt_ = *(lu_byte *)((long)pSVar1 + -8);
    pSVar1 = (StkId)((L->top).offset + 0x10);
    (L->top).p = pSVar1;
  }
  luaO_arith(L,op,&pSVar1[-2].val,&pSVar1[-1].val,pSVar1 + -2);
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_arith (lua_State *L, int op) {
  lua_lock(L);
  if (op != LUA_OPUNM && op != LUA_OPBNOT)
    api_checknelems(L, 2);  /* all other operations expect two operands */
  else {  /* for unary operations, add fake 2nd operand */
    api_checknelems(L, 1);
    setobjs2s(L, L->top.p, L->top.p - 1);
    api_incr_top(L);
  }
  /* first operand at top - 2, second at top - 1; result go to top - 2 */
  luaO_arith(L, op, s2v(L->top.p - 2), s2v(L->top.p - 1), L->top.p - 2);
  L->top.p--;  /* remove second operand */
  lua_unlock(L);
}